

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::LimitTest::configureAttribute
          (LimitTest *this,_iteration iteration,attributeConfiguration *configuration,GLint n_type,
          GLuint program_id,bool use_arrays,bool use_vertex_array)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  glGetAttribLocationFunc p_Var5;
  uint uVar6;
  int iVar7;
  GLuint GVar8;
  GLenum GVar9;
  int iVar10;
  ostream *poVar11;
  TestError *this_01;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  GLuint GVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  stringstream attribute_name;
  long *local_358;
  long local_350;
  long local_348 [2];
  undefined1 local_338 [16];
  TestLog local_328 [13];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  iVar1 = configuration->m_n_attributes_per_group;
  if (n_type < 1) {
    iVar16 = 0;
  }
  else {
    uVar14 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + configuration->m_n_elements[uVar14] * iVar1;
      uVar14 = uVar14 + 1;
    } while ((uint)n_type != uVar14);
  }
  iVar2 = configuration->m_n_elements[n_type];
  iVar3 = configuration->m_n_rows[n_type];
  uVar6 = iVar2 / iVar3;
  if (0 < configuration->m_n_attributes_per_group) {
    iVar4 = configuration->m_vertex_length;
    iVar19 = (iVar1 + 1) * n_type;
    iVar13 = 0;
    do {
      iVar7 = iVar1 * n_type + iVar13;
      std::__cxx11::stringstream::stringstream(local_1b8);
      if (use_arrays) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"attribute_",10);
        poVar11 = (ostream *)std::ostream::operator<<(local_1a8,n_type);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"attribute_",10);
        std::ostream::operator<<(local_1a8,iVar7);
      }
      p_Var5 = (this->super_Base).gl.getAttribLocation;
      std::__cxx11::stringbuf::str();
      GVar8 = (*p_Var5)(program_id,(GLchar *)local_338._0_8_);
      if ((TestLog *)local_338._0_8_ != local_328) {
        operator_delete((void *)local_338._0_8_,(ulong)((long)&(local_328[0].m_log)->flags + 1));
      }
      GVar9 = (*(this->super_Base).gl.getError)();
      glu::checkError(GVar9,"GetAttribLocation",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                      ,0x695);
      if (GVar8 == 0xffffffff) {
        local_338._0_8_ = (this->super_Base).m_log;
        this_00 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"GetAttribLocation(",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)local_358,local_350);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") returned: ",0xc);
        std::ostream::operator<<(this_00,-1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_358 != local_348) {
          operator_delete(local_358,local_348[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_2c0);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Inactive attribute",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                   ,0x69c);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (use_vertex_array) {
        uVar14 = (ulong)uVar6;
        iVar7 = iVar16;
        if (0 < (int)uVar6) {
          do {
            (*(this->super_Base).gl.enableVertexAttribArray)(GVar8);
            GVar9 = (*(this->super_Base).gl.getError)();
            glu::checkError(GVar9,"EnableVertexAttribArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                            ,0x6a9);
            (*(this->super_Base).gl.vertexAttribLPointer)
                      (GVar8,iVar3,0x140a,iVar4 << 3,(void *)((long)iVar7 << 3));
            GVar9 = (*(this->super_Base).gl.getError)();
            glu::checkError(GVar9,"VertexAttribLPointer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                            ,0x6ae);
            GVar8 = GVar8 + 1;
            uVar14 = uVar14 - 1;
            iVar7 = iVar7 + iVar3;
          } while (uVar14 != 0);
        }
      }
      else if (0 < (int)uVar6) {
        uVar21 = 0;
        iVar15 = iVar19;
        iVar20 = iVar19;
        iVar17 = iVar19;
        do {
          if (iteration - DMAT2 < 5) {
            GVar18 = GVar8 + uVar21;
            iVar12 = iVar17;
            if (iVar3 == 3) {
LAB_00a046c5:
              (*(this->super_Base).gl.vertexAttribL3d)
                        (GVar18,(double)iVar12,(double)(iVar12 + 1),(double)(iVar12 + 2));
            }
            else {
              iVar12 = iVar15;
              if (iVar3 == 2) {
                iVar12 = iVar20 + 1;
                iVar10 = iVar20;
LAB_00a04674:
                (*(this->super_Base).gl.vertexAttribL2d)(GVar18,(double)iVar10,(double)iVar12);
              }
              else {
LAB_00a046eb:
                (*(this->super_Base).gl.vertexAttribL4d)
                          (GVar18,(double)iVar12,(double)(iVar12 + 1),(double)(iVar12 + 2),
                           (double)(iVar12 + 3));
              }
            }
          }
          else {
            GVar18 = GVar8;
            if (iteration == DVEC3_DVEC4) {
              iVar12 = iVar7;
              if (iVar3 != 3) goto LAB_00a046eb;
              goto LAB_00a046c5;
            }
            if (iteration == DOUBLE_DVEC2) {
              iVar12 = iVar7 + 2;
              iVar10 = iVar7 + 1;
              if (iVar3 != 1) goto LAB_00a04674;
              (*(this->super_Base).gl.vertexAttribL1d)(GVar8,(double)iVar7);
            }
          }
          uVar21 = uVar21 + 1;
          iVar15 = iVar15 + iVar3;
          iVar17 = iVar17 + 3;
          iVar20 = iVar20 + 2;
        } while (uVar6 != uVar21);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      iVar13 = iVar13 + 1;
      iVar19 = iVar19 + 1;
      iVar16 = iVar16 + iVar2;
    } while (iVar13 < configuration->m_n_attributes_per_group);
  }
  return;
}

Assistant:

void LimitTest::configureAttribute(_iteration iteration, const attributeConfiguration& configuration, GLint n_type,
								   GLuint program_id, bool use_arrays, bool use_vertex_array) const
{
	static const GLint invalid_attrib_location = -1;

	const GLint attributes_index = n_type * configuration.m_n_attributes_per_group;
	const GLint group_offset	 = calculateAttributeGroupOffset(configuration, n_type);
	const GLint n_elements		 = configuration.m_n_elements[n_type];
	const GLint n_rows			 = configuration.m_n_rows[n_type];
	const GLint n_columns		 = n_elements / n_rows;
	const GLint vertex_length	= configuration.m_vertex_length;

	/* For each attribute in "n_type" group */
	for (GLint i = 0; i < configuration.m_n_attributes_per_group; ++i)
	{
		const GLint		  attribute_ordinal = i + attributes_index;
		std::stringstream attribute_name;

		/* Separate attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE[INDEX] */
		if (false == use_arrays)
		{
			attribute_name << "attribute_" << attribute_ordinal;
		}
		else
		{
			attribute_name << "attribute_" << n_type << "[" << i << "]";
		}

		/* get location */
		GLint attribute_location = gl.getAttribLocation(program_id, attribute_name.str().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetAttribLocation");

		if (invalid_attrib_location == attribute_location)
		{
			m_log << tcu::TestLog::Message << "GetAttribLocation(" << program_id << ", " << attribute_name.str()
				  << ") returned: " << attribute_location << tcu::TestLog::EndMessage;

			TCU_FAIL("Inactive attribute");
		}

		/* Configure */
		if (true == use_vertex_array)
		{
			/* With vertex array */
			for (GLint column = 0; column < n_columns; ++column)
			{
				const GLint attribute_offset = group_offset + i * n_elements;
				const GLint column_offset	= column * n_rows;

				gl.enableVertexAttribArray(attribute_location + column);
				GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");

				gl.vertexAttribLPointer(attribute_location + column, n_rows /* size */, GL_DOUBLE,
										static_cast<glw::GLsizei>(vertex_length * sizeof(GLdouble)),
										(GLvoid*)((attribute_offset + column_offset) * sizeof(GLdouble)));
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribLPointer");
			}
		}
		else
		{
			/* As constant */
			for (GLint column = 0; column < n_columns; ++column)
			{
				switch (iteration)
				{
				case DOUBLE_DVEC2:

					/* Double attributes should be assigned the value:
					 (n_attribute + gl_VertexID * 2) */
					/* Dvec2 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 3 + 1,
					 n_attribute + gl_VertexID * 3 + 2)*/

					if (1 == n_rows)
					{
						gl.vertexAttribL1d(attribute_location, attribute_ordinal);
					}
					else
					{
						gl.vertexAttribL2d(attribute_location, attribute_ordinal + 1, attribute_ordinal + 2);
					}

					break;

				case DVEC3_DVEC4:

					/* Dvec3 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 3 + 0,
					 n_attribute + gl_VertexID * 3 + 1,
					 n_attribute + gl_VertexID * 3 + 2).

					 Dvec4 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 4 + 0,
					 n_attribute + gl_VertexID * 4 + 1,
					 n_attribute + gl_VertexID * 4 + 2,
					 n_attribute + gl_VertexID * 4 + 3).*/

					if (3 == n_rows)
					{
						gl.vertexAttribL3d(attribute_location, attribute_ordinal + 0, attribute_ordinal + 1,
										   attribute_ordinal + 2);
					}
					else
					{
						gl.vertexAttribL4d(attribute_location, attribute_ordinal + 0, attribute_ordinal + 1,
										   attribute_ordinal + 2, attribute_ordinal + 3);
					}

					break;

				case DMAT2:
				case DMAT3X2_DMAT4X2:
				case DMAT2X3_DMAT2X4:
				case DMAT3_DMAT3X4:
				case DMAT4X3_DMAT4:

					/* Subsequent matrix elements should be assigned the following value:
					 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

					if (2 == n_rows)
					{
						gl.vertexAttribL2d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows);
					}
					else if (3 == n_rows)
					{
						gl.vertexAttribL3d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows,
										   n_type + attribute_ordinal + 2 + column * n_rows);
					}
					else
					{
						gl.vertexAttribL4d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows,
										   n_type + attribute_ordinal + 2 + column * n_rows,
										   n_type + attribute_ordinal + 3 + column * n_rows);
					}

					break;
				}
			}
		}
	}
}